

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O0

void __thiscall vigra::BmpDecoderImpl::read_colormap(BmpDecoderImpl *this)

{
  undefined2 uVar1;
  value_type vVar2;
  value_type *pvVar3;
  byte *pbVar4;
  long in_RDI;
  uint i;
  uint num_colors;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint uVar5;
  uint in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe4;
  value_type in_stack_ffffffffffffffe5;
  value_type in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  undefined4 local_10;
  
  uVar1 = *(undefined2 *)(in_RDI + 0x222);
  void_vector<unsigned_char>::resize
            ((void_vector<unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffffe7,
                      CONCAT16(in_stack_ffffffffffffffe6,
                               CONCAT15(in_stack_ffffffffffffffe5,
                                        CONCAT14(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0
                                                )))),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(undefined1 *)(in_RDI + 0x274) = 1;
  for (local_10 = 0; local_10 < (uint)(1 << ((byte)uVar1 & 0x1f)); local_10 = local_10 + 1) {
    vVar2 = std::istream::get();
    pvVar3 = void_vector<unsigned_char>::operator[]
                       ((void_vector<unsigned_char> *)
                        CONCAT17(in_stack_ffffffffffffffe7,
                                 CONCAT16(in_stack_ffffffffffffffe6,
                                          CONCAT15(in_stack_ffffffffffffffe5,
                                                   CONCAT14(vVar2,in_stack_ffffffffffffffe0)))),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    *pvVar3 = vVar2;
    in_stack_ffffffffffffffe5 = std::istream::get();
    pvVar3 = void_vector<unsigned_char>::operator[]
                       ((void_vector<unsigned_char> *)
                        CONCAT17(in_stack_ffffffffffffffe7,
                                 CONCAT16(in_stack_ffffffffffffffe6,
                                          CONCAT15(in_stack_ffffffffffffffe5,
                                                   CONCAT14(vVar2,in_stack_ffffffffffffffe0)))),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    *pvVar3 = in_stack_ffffffffffffffe5;
    in_stack_ffffffffffffffe6 = std::istream::get();
    pvVar3 = void_vector<unsigned_char>::operator[]
                       ((void_vector<unsigned_char> *)
                        CONCAT17(in_stack_ffffffffffffffe7,
                                 CONCAT16(in_stack_ffffffffffffffe6,
                                          CONCAT15(in_stack_ffffffffffffffe5,
                                                   CONCAT14(vVar2,in_stack_ffffffffffffffe0)))),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    *pvVar3 = in_stack_ffffffffffffffe6;
    std::istream::get();
    in_stack_ffffffffffffffe7 = false;
    uVar5 = in_stack_ffffffffffffffdc;
    if ((*(byte *)(in_RDI + 0x274) & 1) != 0) {
      pbVar4 = void_vector<unsigned_char>::operator[]
                         ((void_vector<unsigned_char> *)
                          (ulong)CONCAT16(in_stack_ffffffffffffffe6,
                                          CONCAT15(in_stack_ffffffffffffffe5,
                                                   CONCAT14(vVar2,in_stack_ffffffffffffffe0))),
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      in_stack_ffffffffffffffe0 = (uint)*pbVar4;
      pbVar4 = void_vector<unsigned_char>::operator[]
                         ((void_vector<unsigned_char> *)
                          CONCAT17(in_stack_ffffffffffffffe7,
                                   CONCAT16(in_stack_ffffffffffffffe6,
                                            CONCAT15(in_stack_ffffffffffffffe5,
                                                     CONCAT14(vVar2,in_stack_ffffffffffffffe0)))),
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      in_stack_ffffffffffffffe7 = in_stack_ffffffffffffffe0 == *pbVar4;
      uVar5 = in_stack_ffffffffffffffdc;
    }
    *(undefined1 *)(in_RDI + 0x274) = in_stack_ffffffffffffffe7;
    in_stack_ffffffffffffffdc = uVar5 & 0xffffff;
    if ((*(byte *)(in_RDI + 0x274) & 1) != 0) {
      pbVar4 = void_vector<unsigned_char>::operator[]
                         ((void_vector<unsigned_char> *)
                          CONCAT17(in_stack_ffffffffffffffe7,
                                   CONCAT16(in_stack_ffffffffffffffe6,
                                            CONCAT15(in_stack_ffffffffffffffe5,
                                                     CONCAT14(vVar2,in_stack_ffffffffffffffe0)))),
                          CONCAT44(uVar5,in_stack_ffffffffffffffd8) & 0xffffffffffffff);
      in_stack_ffffffffffffffd8 = (uint)*pbVar4;
      pbVar4 = void_vector<unsigned_char>::operator[]
                         ((void_vector<unsigned_char> *)
                          CONCAT17(in_stack_ffffffffffffffe7,
                                   CONCAT16(in_stack_ffffffffffffffe6,
                                            CONCAT15(in_stack_ffffffffffffffe5,
                                                     CONCAT14(vVar2,in_stack_ffffffffffffffe0)))),
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      in_stack_ffffffffffffffdc =
           CONCAT13(in_stack_ffffffffffffffd8 == *pbVar4,(int3)in_stack_ffffffffffffffdc);
    }
    *(char *)(in_RDI + 0x274) = (char)(in_stack_ffffffffffffffdc >> 0x18);
  }
  return;
}

Assistant:

void BmpDecoderImpl::read_colormap ()
{
    const unsigned int num_colors = 1 << info_header.bit_count;
    map.resize( 3 * num_colors );
    grayscale = true;
    for ( unsigned int i = 0; i < num_colors; ++i ) {
        map[ 3 * i + 2 ] = stream.get();
        map[ 3 * i + 1 ] = stream.get();
        map[ 3 * i     ] = stream.get();
        stream.get(); // skip unused byte
        grayscale = grayscale && ( map[ 3 * i ] == map[ 3 * i + 1 ] );
        grayscale = grayscale && ( map[ 3 * i + 1 ] == map[ 3 * i + 2 ] );
    }
}